

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arc.c
# Opt level: O2

atom make_string(char *x)

{
  anon_union_8_9_1d3277aa_for_value aVar1;
  atom aVar2;
  atom a;
  
  alloc_count = alloc_count + 1;
  aVar1.pair = (pair *)malloc(0x18);
  (aVar1.str)->value = x;
  (aVar1.str)->mark = '\0';
  (aVar1.str)->next = str_head;
  a.value.str = (str *)aVar1.pair;
  a._0_8_ = 7;
  str_head = (str *)aVar1.pair;
  stack_add(a);
  aVar2.value.str = (str *)aVar1.pair;
  aVar2._0_8_ = 7;
  return aVar2;
}

Assistant:

atom make_string(char *x)
{
	atom a;
	struct str *s;
	alloc_count++;
	s = a.value.str = malloc(sizeof(struct str));
	s->value = x;
	s->mark = 0;
	s->next = str_head;
	str_head = s;

	a.type = T_STRING;
	stack_add(a);
	return a;
}